

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::QuadMvIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  vfloat<4> vVar4;
  BVH *bvh;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  undefined8 uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  byte bVar22;
  int iVar23;
  byte bVar24;
  byte bVar25;
  ulong uVar26;
  long lVar27;
  NodeRef root;
  size_t sVar28;
  size_t sVar29;
  byte bVar30;
  uint uVar31;
  ulong uVar32;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar33;
  undefined4 uVar34;
  NodeRef *pNVar35;
  bool bVar36;
  ulong uVar37;
  ulong uVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [64];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar95;
  float fVar98;
  float fVar99;
  undefined1 auVar96 [16];
  float fVar100;
  undefined1 auVar97 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  Precalculations pre;
  undefined1 local_1978 [16];
  RayK<4> *local_1968;
  undefined4 local_195c;
  RTCFilterFunctionNArguments args;
  RTCHitN local_18c8 [16];
  undefined1 local_18b8 [16];
  undefined1 local_18a8 [16];
  undefined1 local_1898 [16];
  undefined1 local_1888 [16];
  undefined1 local_1878 [16];
  undefined1 local_1868 [16];
  uint local_1858;
  uint uStack_1854;
  uint uStack_1850;
  uint uStack_184c;
  uint uStack_1848;
  uint uStack_1844;
  uint uStack_1840;
  uint uStack_183c;
  TravRayK<4,_true> tray;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar39 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
    auVar43 = ZEXT816(0) << 0x40;
    uVar10 = vcmpps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar43,5);
    uVar37 = vpcmpeqd_avx512vl(auVar39,(undefined1  [16])valid_i->field_0);
    uVar37 = ((byte)uVar10 & 0xf) & uVar37;
    bVar30 = (byte)uVar37;
    if (bVar30 != 0) {
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar39 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar105 = ZEXT1664(auVar39);
      auVar40 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar39);
      auVar62._8_4_ = 0x219392ef;
      auVar62._0_8_ = 0x219392ef219392ef;
      auVar62._12_4_ = 0x219392ef;
      uVar26 = vcmpps_avx512vl(auVar40,auVar62,1);
      auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar106 = ZEXT1664(auVar40);
      auVar41 = vdivps_avx512vl(auVar40,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar42 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar39);
      uVar32 = vcmpps_avx512vl(auVar42,auVar62,1);
      auVar42 = vdivps_avx512vl(auVar40,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar39 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar39);
      uVar38 = vcmpps_avx512vl(auVar39,auVar62,1);
      auVar39 = vdivps_avx512vl(auVar40,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      bVar36 = (bool)((byte)uVar26 & 1);
      tray.rdir.field_0._0_4_ = (uint)bVar36 * 0x5d5e0b6b | (uint)!bVar36 * auVar41._0_4_;
      bVar36 = (bool)((byte)(uVar26 >> 1) & 1);
      tray.rdir.field_0._4_4_ = (uint)bVar36 * 0x5d5e0b6b | (uint)!bVar36 * auVar41._4_4_;
      bVar36 = (bool)((byte)(uVar26 >> 2) & 1);
      tray.rdir.field_0._8_4_ = (uint)bVar36 * 0x5d5e0b6b | (uint)!bVar36 * auVar41._8_4_;
      bVar36 = (bool)((byte)(uVar26 >> 3) & 1);
      tray.rdir.field_0._12_4_ = (uint)bVar36 * 0x5d5e0b6b | (uint)!bVar36 * auVar41._12_4_;
      bVar36 = (bool)((byte)uVar32 & 1);
      tray.rdir.field_0._16_4_ = (uint)bVar36 * 0x5d5e0b6b | (uint)!bVar36 * auVar42._0_4_;
      bVar36 = (bool)((byte)(uVar32 >> 1) & 1);
      tray.rdir.field_0._20_4_ = (uint)bVar36 * 0x5d5e0b6b | (uint)!bVar36 * auVar42._4_4_;
      bVar36 = (bool)((byte)(uVar32 >> 2) & 1);
      tray.rdir.field_0._24_4_ = (uint)bVar36 * 0x5d5e0b6b | (uint)!bVar36 * auVar42._8_4_;
      bVar36 = (bool)((byte)(uVar32 >> 3) & 1);
      tray.rdir.field_0._28_4_ = (uint)bVar36 * 0x5d5e0b6b | (uint)!bVar36 * auVar42._12_4_;
      bVar36 = (bool)((byte)uVar38 & 1);
      tray.rdir.field_0._32_4_ = (uint)bVar36 * 0x5d5e0b6b | (uint)!bVar36 * auVar39._0_4_;
      bVar36 = (bool)((byte)(uVar38 >> 1) & 1);
      tray.rdir.field_0._36_4_ = (uint)bVar36 * 0x5d5e0b6b | (uint)!bVar36 * auVar39._4_4_;
      bVar36 = (bool)((byte)(uVar38 >> 2) & 1);
      tray.rdir.field_0._40_4_ = (uint)bVar36 * 0x5d5e0b6b | (uint)!bVar36 * auVar39._8_4_;
      bVar36 = (bool)((byte)(uVar38 >> 3) & 1);
      tray.rdir.field_0._44_4_ = (uint)bVar36 * 0x5d5e0b6b | (uint)!bVar36 * auVar39._12_4_;
      uVar26 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar43,1);
      auVar39 = vpbroadcastd_avx512vl(ZEXT416(0x10));
      tray.nearXYZ.field_0._0_4_ = (uint)((byte)uVar26 & 1) * auVar39._0_4_;
      tray.nearXYZ.field_0._4_4_ = (uint)((byte)(uVar26 >> 1) & 1) * auVar39._4_4_;
      tray.nearXYZ.field_0._8_4_ = (uint)((byte)(uVar26 >> 2) & 1) * auVar39._8_4_;
      tray.nearXYZ.field_0._12_4_ = (uint)((byte)(uVar26 >> 3) & 1) * auVar39._12_4_;
      local_195c = (undefined4)uVar37;
      uVar26 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar43,5);
      auVar39 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      bVar36 = (bool)((byte)uVar26 & 1);
      bVar7 = (bool)((byte)(uVar26 >> 1) & 1);
      bVar8 = (bool)((byte)(uVar26 >> 2) & 1);
      bVar9 = (bool)((byte)(uVar26 >> 3) & 1);
      tray.nearXYZ.field_0._16_4_ = (uint)bVar36 * auVar39._0_4_ | (uint)!bVar36 * 0x30;
      tray.nearXYZ.field_0._20_4_ = (uint)bVar7 * auVar39._4_4_ | (uint)!bVar7 * 0x30;
      tray.nearXYZ.field_0._24_4_ = (uint)bVar8 * auVar39._8_4_ | (uint)!bVar8 * 0x30;
      tray.nearXYZ.field_0._28_4_ = (uint)bVar9 * auVar39._12_4_ | (uint)!bVar9 * 0x30;
      uVar26 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar43,5);
      auVar39 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar36 = (bool)((byte)uVar26 & 1);
      bVar7 = (bool)((byte)(uVar26 >> 1) & 1);
      bVar8 = (bool)((byte)(uVar26 >> 2) & 1);
      bVar9 = (bool)((byte)(uVar26 >> 3) & 1);
      tray.nearXYZ.field_0._32_4_ = (uint)bVar36 * auVar39._0_4_ | (uint)!bVar36 * 0x50;
      tray.nearXYZ.field_0._36_4_ = (uint)bVar7 * auVar39._4_4_ | (uint)!bVar7 * 0x50;
      tray.nearXYZ.field_0._40_4_ = (uint)bVar8 * auVar39._8_4_ | (uint)!bVar8 * 0x50;
      tray.nearXYZ.field_0._44_4_ = (uint)bVar9 * auVar39._12_4_ | (uint)!bVar9 * 0x50;
      stack_near[0].field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vbroadcastss_avx512vl(ZEXT416(0x7f800000))
      ;
      auVar107 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      auVar39 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),auVar43);
      tray.tnear.field_0._0_4_ =
           (uint)(bVar30 & 1) * auVar39._0_4_ |
           (uint)!(bool)(bVar30 & 1) * stack_near[0].field_0._0_4_;
      bVar36 = (bool)((byte)(uVar37 >> 1) & 1);
      tray.tnear.field_0._4_4_ =
           (uint)bVar36 * auVar39._4_4_ | (uint)!bVar36 * stack_near[0].field_0._4_4_;
      bVar36 = (bool)((byte)(uVar37 >> 2) & 1);
      tray.tnear.field_0._8_4_ =
           (uint)bVar36 * auVar39._8_4_ | (uint)!bVar36 * stack_near[0].field_0._8_4_;
      bVar36 = SUB81(uVar37 >> 3,0);
      tray.tnear.field_0._12_4_ =
           (uint)bVar36 * auVar39._12_4_ | (uint)!bVar36 * stack_near[0].field_0._12_4_;
      auVar39 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar43);
      tray.tfar.field_0.i[0] =
           (uint)(bVar30 & 1) * auVar39._0_4_ | (uint)!(bool)(bVar30 & 1) * -0x800000;
      bVar36 = (bool)((byte)(uVar37 >> 1) & 1);
      tray.tfar.field_0.i[1] = (uint)bVar36 * auVar39._4_4_ | (uint)!bVar36 * -0x800000;
      bVar36 = (bool)((byte)(uVar37 >> 2) & 1);
      tray.tfar.field_0.i[2] = (uint)bVar36 * auVar39._8_4_ | (uint)!bVar36 * -0x800000;
      bVar36 = SUB81(uVar37 >> 3,0);
      tray.tfar.field_0.i[3] = (uint)bVar36 * auVar39._12_4_ | (uint)!bVar36 * -0x800000;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar31 = 3;
      }
      else {
        uVar31 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      local_1968 = ray + 0x80;
      bVar30 = (byte)((ushort)((short)uVar37 << 0xc) >> 0xc) ^ 0xf;
      pNVar35 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar33 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar39 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
      auVar108 = ZEXT1664(auVar39);
      auVar39 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
      auVar109 = ZEXT1664(auVar39);
      auVar39 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
      auVar110 = ZEXT1664(auVar39);
      auVar39 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar104 = ZEXT1664(auVar39);
LAB_006a470d:
      do {
        do {
          root.ptr = pNVar35[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_006a5743;
          pNVar35 = pNVar35 + -1;
          vVar4.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar33[-1].v;
          auVar77 = ZEXT1664((undefined1  [16])vVar4.field_0);
          paVar33 = paVar33 + -1;
          uVar37 = vcmpps_avx512vl((undefined1  [16])vVar4.field_0,
                                   (undefined1  [16])tray.tfar.field_0,1);
        } while ((char)uVar37 == '\0');
        uVar34 = (undefined4)uVar37;
        if (uVar31 < (uint)POPCOUNT(uVar34)) {
LAB_006a474c:
          do {
            iVar23 = 4;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_006a5743;
              uVar10 = vcmpps_avx512vl(auVar77._0_16_,(undefined1  [16])tray.tfar.field_0,9);
              if ((char)uVar10 == '\0') goto LAB_006a470d;
              uVar37 = (ulong)((uint)root.ptr & 0xf);
              bVar22 = bVar30 & 0xf;
              if (uVar37 == 8) goto LAB_006a560e;
              bVar22 = bVar22 ^ 0xf;
              lVar27 = (root.ptr & 0xfffffffffffffff0) + 0xc0;
              uVar26 = 0;
              goto LAB_006a4928;
            }
            lVar27 = 0;
            sVar29 = 8;
            auVar39 = auVar107._0_16_;
            do {
              sVar28 = *(size_t *)((root.ptr & 0xfffffffffffffff0) + lVar27 * 8);
              if (sVar28 == 8) {
                auVar77 = ZEXT1664(auVar39);
                sVar28 = sVar29;
                break;
              }
              uVar34 = *(undefined4 *)(root.ptr + 0x20 + lVar27 * 4);
              auVar70._4_4_ = uVar34;
              auVar70._0_4_ = uVar34;
              auVar70._8_4_ = uVar34;
              auVar70._12_4_ = uVar34;
              auVar17._8_8_ = tray.org.field_0._8_8_;
              auVar17._0_8_ = tray.org.field_0._0_8_;
              auVar18._8_8_ = tray.org.field_0._24_8_;
              auVar18._0_8_ = tray.org.field_0._16_8_;
              auVar19._8_8_ = tray.org.field_0._40_8_;
              auVar19._0_8_ = tray.org.field_0._32_8_;
              auVar43 = vsubps_avx(auVar70,auVar17);
              auVar90._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar43._0_4_;
              auVar90._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar43._4_4_;
              auVar90._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar43._8_4_;
              auVar90._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar43._12_4_;
              uVar34 = *(undefined4 *)(root.ptr + 0x40 + lVar27 * 4);
              auVar71._4_4_ = uVar34;
              auVar71._0_4_ = uVar34;
              auVar71._8_4_ = uVar34;
              auVar71._12_4_ = uVar34;
              auVar43 = vsubps_avx(auVar71,auVar18);
              auVar93._0_4_ = tray.rdir.field_0._16_4_ * auVar43._0_4_;
              auVar93._4_4_ = tray.rdir.field_0._20_4_ * auVar43._4_4_;
              auVar93._8_4_ = tray.rdir.field_0._24_4_ * auVar43._8_4_;
              auVar93._12_4_ = tray.rdir.field_0._28_4_ * auVar43._12_4_;
              uVar34 = *(undefined4 *)(root.ptr + 0x60 + lVar27 * 4);
              auVar72._4_4_ = uVar34;
              auVar72._0_4_ = uVar34;
              auVar72._8_4_ = uVar34;
              auVar72._12_4_ = uVar34;
              auVar43 = vsubps_avx(auVar72,auVar19);
              auVar96._0_4_ = tray.rdir.field_0._32_4_ * auVar43._0_4_;
              auVar96._4_4_ = tray.rdir.field_0._36_4_ * auVar43._4_4_;
              auVar96._8_4_ = tray.rdir.field_0._40_4_ * auVar43._8_4_;
              auVar96._12_4_ = tray.rdir.field_0._44_4_ * auVar43._12_4_;
              uVar34 = *(undefined4 *)(root.ptr + 0x30 + lVar27 * 4);
              auVar73._4_4_ = uVar34;
              auVar73._0_4_ = uVar34;
              auVar73._8_4_ = uVar34;
              auVar73._12_4_ = uVar34;
              auVar43 = vsubps_avx(auVar73,auVar17);
              auVar78._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar43._0_4_;
              auVar78._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar43._4_4_;
              auVar78._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar43._8_4_;
              auVar78._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar43._12_4_;
              uVar34 = *(undefined4 *)(root.ptr + 0x50 + lVar27 * 4);
              auVar74._4_4_ = uVar34;
              auVar74._0_4_ = uVar34;
              auVar74._8_4_ = uVar34;
              auVar74._12_4_ = uVar34;
              auVar43 = vsubps_avx(auVar74,auVar18);
              auVar81._0_4_ = tray.rdir.field_0._16_4_ * auVar43._0_4_;
              auVar81._4_4_ = tray.rdir.field_0._20_4_ * auVar43._4_4_;
              auVar81._8_4_ = tray.rdir.field_0._24_4_ * auVar43._8_4_;
              auVar81._12_4_ = tray.rdir.field_0._28_4_ * auVar43._12_4_;
              uVar34 = *(undefined4 *)(root.ptr + 0x70 + lVar27 * 4);
              auVar75._4_4_ = uVar34;
              auVar75._0_4_ = uVar34;
              auVar75._8_4_ = uVar34;
              auVar75._12_4_ = uVar34;
              auVar43 = vsubps_avx(auVar75,auVar19);
              auVar86._0_4_ = tray.rdir.field_0._32_4_ * auVar43._0_4_;
              auVar86._4_4_ = tray.rdir.field_0._36_4_ * auVar43._4_4_;
              auVar86._8_4_ = tray.rdir.field_0._40_4_ * auVar43._8_4_;
              auVar86._12_4_ = tray.rdir.field_0._44_4_ * auVar43._12_4_;
              auVar43 = vminps_avx(auVar90,auVar78);
              auVar40 = vminps_avx(auVar93,auVar81);
              auVar43 = vmaxps_avx(auVar43,auVar40);
              auVar40 = vminps_avx(auVar96,auVar86);
              auVar43 = vmaxps_avx(auVar43,auVar40);
              auVar41 = vmulps_avx512vl(auVar43,auVar108._0_16_);
              auVar43 = vmaxps_avx(auVar90,auVar78);
              auVar40 = vmaxps_avx(auVar93,auVar81);
              auVar40 = vminps_avx(auVar43,auVar40);
              auVar43 = vmaxps_avx(auVar96,auVar86);
              auVar43 = vminps_avx(auVar40,auVar43);
              auVar40 = vmulps_avx512vl(auVar43,auVar109._0_16_);
              auVar43 = vmaxps_avx(auVar41,(undefined1  [16])tray.tnear.field_0);
              auVar40 = vminps_avx(auVar40,(undefined1  [16])tray.tfar.field_0);
              uVar37 = vcmpps_avx512vl(auVar43,auVar40,2);
              if ((byte)uVar37 == 0) {
                auVar77 = ZEXT1664(auVar39);
                sVar28 = sVar29;
              }
              else {
                auVar43 = vblendmps_avx512vl(auVar107._0_16_,auVar41);
                bVar36 = (bool)((byte)uVar37 & 1);
                bVar7 = (bool)((byte)(uVar37 >> 1) & 1);
                bVar8 = (bool)((byte)(uVar37 >> 2) & 1);
                bVar9 = (bool)((byte)(uVar37 >> 3) & 1);
                auVar77 = ZEXT1664(CONCAT412((uint)bVar9 * auVar43._12_4_ |
                                             (uint)!bVar9 * auVar41._12_4_,
                                             CONCAT48((uint)bVar8 * auVar43._8_4_ |
                                                      (uint)!bVar8 * auVar41._8_4_,
                                                      CONCAT44((uint)bVar7 * auVar43._4_4_ |
                                                               (uint)!bVar7 * auVar41._4_4_,
                                                               (uint)bVar36 * auVar43._0_4_ |
                                                               (uint)!bVar36 * auVar41._0_4_))));
                if (sVar29 != 8) {
                  pNVar35->ptr = sVar29;
                  pNVar35 = pNVar35 + 1;
                  *(undefined1 (*) [16])paVar33->v = auVar39;
                  paVar33 = paVar33 + 1;
                }
              }
              lVar27 = lVar27 + 1;
              auVar39 = auVar77._0_16_;
              sVar29 = sVar28;
            } while (lVar27 != 4);
            if (sVar28 == 8) goto LAB_006a48d3;
            uVar10 = vcmpps_avx512vl((undefined1  [16])auVar77._0_16_,
                                     (undefined1  [16])tray.tfar.field_0,9);
            root.ptr = sVar28;
          } while ((byte)uVar31 < (byte)POPCOUNT((int)uVar10));
          pNVar35->ptr = sVar28;
          pNVar35 = pNVar35 + 1;
          *paVar33 = auVar77._0_16_;
          paVar33 = paVar33 + 1;
        }
        else {
          do {
            sVar29 = 0;
            for (uVar26 = uVar37; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
              sVar29 = sVar29 + 1;
            }
            bVar36 = occluded1(This,bvh,root,sVar29,&pre,ray,&tray,context);
            bVar22 = (byte)(1 << ((uint)sVar29 & 0x1f));
            if (!bVar36) {
              bVar22 = 0;
            }
            bVar30 = bVar30 | bVar22;
            uVar37 = uVar37 - 1 & uVar37;
          } while (uVar37 != 0);
          iVar23 = 3;
          if (bVar30 != 0xf) {
            auVar39 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            tray.tfar.field_0.i[0] =
                 (uint)(bVar30 & 1) * auVar39._0_4_ |
                 (uint)!(bool)(bVar30 & 1) * tray.tfar.field_0.i[0];
            bVar36 = (bool)(bVar30 >> 1 & 1);
            tray.tfar.field_0.i[1] =
                 (uint)bVar36 * auVar39._4_4_ | (uint)!bVar36 * tray.tfar.field_0.i[1];
            bVar36 = (bool)(bVar30 >> 2 & 1);
            tray.tfar.field_0.i[2] =
                 (uint)bVar36 * auVar39._8_4_ | (uint)!bVar36 * tray.tfar.field_0.i[2];
            bVar36 = (bool)(bVar30 >> 3 & 1);
            tray.tfar.field_0.i[3] =
                 (uint)bVar36 * auVar39._12_4_ | (uint)!bVar36 * tray.tfar.field_0.i[3];
            iVar23 = 2;
          }
          auVar39 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar105 = ZEXT1664(auVar39);
          auVar39 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar106 = ZEXT1664(auVar39);
          auVar39 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          auVar107 = ZEXT1664(auVar39);
          auVar39 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
          auVar108 = ZEXT1664(auVar39);
          auVar39 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
          auVar109 = ZEXT1664(auVar39);
          auVar39 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
          auVar110 = ZEXT1664(auVar39);
          auVar39 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar104 = ZEXT1664(auVar39);
          auVar77 = ZEXT1664((undefined1  [16])vVar4.field_0);
          if (uVar31 < (uint)POPCOUNT(uVar34)) goto LAB_006a474c;
        }
LAB_006a48d3:
      } while (iVar23 != 3);
LAB_006a5743:
      bVar30 = bVar30 & (byte)local_195c;
      bVar36 = (bool)(bVar30 >> 1 & 1);
      bVar7 = (bool)(bVar30 >> 2 & 1);
      bVar8 = (bool)(bVar30 >> 3 & 1);
      *(uint *)local_1968 =
           (uint)(bVar30 & 1) * -0x800000 | (uint)!(bool)(bVar30 & 1) * *(int *)local_1968;
      *(uint *)(local_1968 + 4) =
           (uint)bVar36 * -0x800000 | (uint)!bVar36 * *(int *)(local_1968 + 4);
      *(uint *)(local_1968 + 8) = (uint)bVar7 * -0x800000 | (uint)!bVar7 * *(int *)(local_1968 + 8);
      *(uint *)(local_1968 + 0xc) =
           (uint)bVar8 * -0x800000 | (uint)!bVar8 * *(int *)(local_1968 + 0xc);
    }
  }
  return;
  while( true ) {
    uVar26 = uVar26 + 1;
    lVar27 = lVar27 + 0xe0;
    if (uVar37 - 8 <= uVar26) break;
LAB_006a4928:
    uVar32 = 0;
    bVar25 = bVar22;
    while (uVar38 = (ulong)*(uint *)(lVar27 + uVar32 * 4), uVar38 != 0xffffffff) {
      uVar34 = *(undefined4 *)(lVar27 + -0xc0 + uVar32 * 4);
      auVar64._4_4_ = uVar34;
      auVar64._0_4_ = uVar34;
      auVar64._8_4_ = uVar34;
      auVar64._12_4_ = uVar34;
      uVar34 = *(undefined4 *)(lVar27 + -0xb0 + uVar32 * 4);
      auVar76._4_4_ = uVar34;
      auVar76._0_4_ = uVar34;
      auVar76._8_4_ = uVar34;
      auVar76._12_4_ = uVar34;
      uVar34 = *(undefined4 *)(lVar27 + -0xa0 + uVar32 * 4);
      auVar79._4_4_ = uVar34;
      auVar79._0_4_ = uVar34;
      auVar79._8_4_ = uVar34;
      auVar79._12_4_ = uVar34;
      uVar34 = *(undefined4 *)(lVar27 + -0x90 + uVar32 * 4);
      auVar101._4_4_ = uVar34;
      auVar101._0_4_ = uVar34;
      auVar101._8_4_ = uVar34;
      auVar101._12_4_ = uVar34;
      uVar34 = *(undefined4 *)(lVar27 + -0x80 + uVar32 * 4);
      auVar102._4_4_ = uVar34;
      auVar102._0_4_ = uVar34;
      auVar102._8_4_ = uVar34;
      auVar102._12_4_ = uVar34;
      uVar34 = *(undefined4 *)(lVar27 + -0x70 + uVar32 * 4);
      auVar103._4_4_ = uVar34;
      auVar103._0_4_ = uVar34;
      auVar103._8_4_ = uVar34;
      auVar103._12_4_ = uVar34;
      uVar34 = *(undefined4 *)(lVar27 + -0x60 + uVar32 * 4);
      uVar1 = *(undefined4 *)(lVar27 + -0x50 + uVar32 * 4);
      uVar2 = *(undefined4 *)(lVar27 + -0x40 + uVar32 * 4);
      auVar44 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar27 + -0x30 + uVar32 * 4)));
      auVar45 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar27 + -0x20 + uVar32 * 4)));
      auVar46 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar27 + -0x10 + uVar32 * 4)));
      auVar39 = *(undefined1 (*) [16])ray;
      auVar43 = *(undefined1 (*) [16])(ray + 0x10);
      auVar40 = *(undefined1 (*) [16])(ray + 0x20);
      auVar41 = *(undefined1 (*) [16])(ray + 0x40);
      auVar42 = *(undefined1 (*) [16])(ray + 0x50);
      auVar62 = *(undefined1 (*) [16])(ray + 0x60);
      auVar64 = vsubps_avx(auVar64,auVar39);
      auVar76 = vsubps_avx(auVar76,auVar43);
      auVar79 = vsubps_avx(auVar79,auVar40);
      auVar60 = vsubps_avx(auVar101,auVar39);
      auVar61 = vsubps_avx(auVar102,auVar43);
      auVar47 = vsubps_avx512vl(auVar103,auVar40);
      auVar48 = vsubps_avx512vl(auVar44,auVar39);
      auVar49 = vsubps_avx512vl(auVar45,auVar43);
      auVar50 = vsubps_avx512vl(auVar46,auVar40);
      auVar51 = vsubps_avx512vl(auVar48,auVar64);
      auVar52 = vsubps_avx512vl(auVar49,auVar76);
      auVar53 = vsubps_avx512vl(auVar50,auVar79);
      auVar54 = vsubps_avx512vl(auVar64,auVar60);
      auVar55 = vsubps_avx512vl(auVar76,auVar61);
      auVar56 = vsubps_avx512vl(auVar79,auVar47);
      auVar40 = vaddps_avx512vl(auVar48,auVar64);
      auVar57 = vaddps_avx512vl(auVar49,auVar76);
      auVar39 = vaddps_avx512vl(auVar50,auVar79);
      auVar43._0_4_ = auVar53._0_4_ * auVar57._0_4_;
      auVar43._4_4_ = auVar53._4_4_ * auVar57._4_4_;
      auVar43._8_4_ = auVar53._8_4_ * auVar57._8_4_;
      auVar43._12_4_ = auVar53._12_4_ * auVar57._12_4_;
      auVar43 = vfmsub231ps_fma(auVar43,auVar52,auVar39);
      auVar63._0_4_ = auVar51._0_4_ * auVar39._0_4_;
      auVar63._4_4_ = auVar51._4_4_ * auVar39._4_4_;
      auVar63._8_4_ = auVar51._8_4_ * auVar39._8_4_;
      auVar63._12_4_ = auVar51._12_4_ * auVar39._12_4_;
      auVar39 = vfmsub231ps_fma(auVar63,auVar53,auVar40);
      auVar58._0_4_ = auVar52._0_4_ * auVar40._0_4_;
      auVar58._4_4_ = auVar52._4_4_ * auVar40._4_4_;
      auVar58._8_4_ = auVar52._8_4_ * auVar40._8_4_;
      auVar58._12_4_ = auVar52._12_4_ * auVar40._12_4_;
      auVar40 = vfmsub231ps_fma(auVar58,auVar51,auVar57);
      fVar95 = auVar62._0_4_;
      auVar57._0_4_ = fVar95 * auVar40._0_4_;
      fVar98 = auVar62._4_4_;
      auVar57._4_4_ = fVar98 * auVar40._4_4_;
      fVar99 = auVar62._8_4_;
      auVar57._8_4_ = fVar99 * auVar40._8_4_;
      fVar100 = auVar62._12_4_;
      auVar57._12_4_ = fVar100 * auVar40._12_4_;
      auVar39 = vfmadd231ps_fma(auVar57,auVar42,auVar39);
      auVar39 = vfmadd231ps_fma(auVar39,auVar41,auVar43);
      auVar59._0_4_ = auVar60._0_4_ + auVar64._0_4_;
      auVar59._4_4_ = auVar60._4_4_ + auVar64._4_4_;
      auVar59._8_4_ = auVar60._8_4_ + auVar64._8_4_;
      auVar59._12_4_ = auVar60._12_4_ + auVar64._12_4_;
      auVar80._0_4_ = auVar61._0_4_ + auVar76._0_4_;
      auVar80._4_4_ = auVar61._4_4_ + auVar76._4_4_;
      auVar80._8_4_ = auVar61._8_4_ + auVar76._8_4_;
      auVar80._12_4_ = auVar61._12_4_ + auVar76._12_4_;
      auVar43 = vaddps_avx512vl(auVar79,auVar47);
      auVar40 = vmulps_avx512vl(auVar80,auVar56);
      auVar40 = vfmsub231ps_avx512vl(auVar40,auVar55,auVar43);
      auVar43 = vmulps_avx512vl(auVar43,auVar54);
      auVar43 = vfmsub231ps_avx512vl(auVar43,auVar56,auVar59);
      auVar57 = vmulps_avx512vl(auVar59,auVar55);
      auVar57 = vfmsub231ps_avx512vl(auVar57,auVar54,auVar80);
      auVar58 = vsubps_avx512vl(auVar60,auVar48);
      auVar82._0_4_ = fVar95 * auVar57._0_4_;
      auVar82._4_4_ = fVar98 * auVar57._4_4_;
      auVar82._8_4_ = fVar99 * auVar57._8_4_;
      auVar82._12_4_ = fVar100 * auVar57._12_4_;
      auVar43 = vfmadd231ps_avx512vl(auVar82,auVar42,auVar43);
      auVar57 = vsubps_avx512vl(auVar61,auVar49);
      auVar43 = vfmadd231ps_fma(auVar43,auVar41,auVar40);
      auVar59 = vsubps_avx512vl(auVar47,auVar50);
      auVar40 = vaddps_avx512vl(auVar60,auVar48);
      auVar60 = vaddps_avx512vl(auVar61,auVar49);
      auVar61 = vaddps_avx512vl(auVar47,auVar50);
      auVar47 = vmulps_avx512vl(auVar60,auVar59);
      auVar47 = vfmsub231ps_avx512vl(auVar47,auVar57,auVar61);
      auVar61 = vmulps_avx512vl(auVar61,auVar58);
      auVar61 = vfmsub231ps_avx512vl(auVar61,auVar59,auVar40);
      auVar48._0_4_ = auVar40._0_4_ * auVar57._0_4_;
      auVar48._4_4_ = auVar40._4_4_ * auVar57._4_4_;
      auVar48._8_4_ = auVar40._8_4_ * auVar57._8_4_;
      auVar48._12_4_ = auVar40._12_4_ * auVar57._12_4_;
      auVar40 = vfmsub231ps_fma(auVar48,auVar58,auVar60);
      auVar40 = vmulps_avx512vl(auVar40,auVar62);
      auVar40 = vfmadd231ps_avx512vl(auVar40,auVar42,auVar61);
      auVar40 = vfmadd231ps_avx512vl(auVar40,auVar41,auVar47);
      auVar60._0_4_ = auVar39._0_4_ + auVar43._0_4_;
      auVar60._4_4_ = auVar39._4_4_ + auVar43._4_4_;
      auVar60._8_4_ = auVar39._8_4_ + auVar43._8_4_;
      auVar60._12_4_ = auVar39._12_4_ + auVar43._12_4_;
      auVar62 = vaddps_avx512vl(auVar40,auVar60);
      auVar49 = auVar105._0_16_;
      auVar60 = vandps_avx512vl(auVar62,auVar49);
      auVar61 = vmulps_avx512vl(auVar60,auVar110._0_16_);
      auVar47 = vminps_avx512vl(auVar39,auVar43);
      auVar47 = vminps_avx512vl(auVar47,auVar40);
      auVar48 = vxorps_avx512vl(auVar61,auVar104._0_16_);
      uVar10 = vcmpps_avx512vl(auVar47,auVar48,5);
      auVar47 = vmaxps_avx512vl(auVar39,auVar43);
      auVar40 = vmaxps_avx512vl(auVar47,auVar40);
      uVar11 = vcmpps_avx512vl(auVar40,auVar61,2);
      bVar24 = ((byte)uVar10 | (byte)uVar11) & 0xf & bVar25;
      if (bVar24 != 0) {
        auVar40 = vmulps_avx512vl(auVar55,auVar53);
        auVar61 = vmulps_avx512vl(auVar51,auVar56);
        auVar47 = vmulps_avx512vl(auVar54,auVar52);
        auVar48 = vmulps_avx512vl(auVar57,auVar56);
        auVar50 = vmulps_avx512vl(auVar54,auVar59);
        auVar63 = vmulps_avx512vl(auVar58,auVar55);
        auVar52 = vfmsub213ps_avx512vl(auVar52,auVar56,auVar40);
        auVar53 = vfmsub213ps_avx512vl(auVar53,auVar54,auVar61);
        auVar51 = vfmsub213ps_avx512vl(auVar51,auVar55,auVar47);
        auVar55 = vfmsub213ps_avx512vl(auVar59,auVar55,auVar48);
        auVar56 = vfmsub213ps_avx512vl(auVar58,auVar56,auVar50);
        auVar54 = vfmsub213ps_avx512vl(auVar57,auVar54,auVar63);
        auVar40 = vandps_avx512vl(auVar40,auVar49);
        auVar48 = vandps_avx512vl(auVar48,auVar49);
        uVar12 = vcmpps_avx512vl(auVar40,auVar48,1);
        auVar40 = vandps_avx512vl(auVar61,auVar49);
        auVar61 = vandps_avx512vl(auVar50,auVar49);
        uVar13 = vcmpps_avx512vl(auVar40,auVar61,1);
        auVar40 = vandps_avx512vl(auVar47,auVar49);
        auVar61 = vandps_avx512vl(auVar63,auVar49);
        uVar14 = vcmpps_avx512vl(auVar40,auVar61,1);
        bVar36 = (bool)((byte)uVar12 & 1);
        auVar61._0_4_ = (uint)bVar36 * auVar52._0_4_ | (uint)!bVar36 * auVar55._0_4_;
        bVar36 = (bool)((byte)(uVar12 >> 1) & 1);
        auVar61._4_4_ = (uint)bVar36 * auVar52._4_4_ | (uint)!bVar36 * auVar55._4_4_;
        bVar36 = (bool)((byte)(uVar12 >> 2) & 1);
        auVar61._8_4_ = (uint)bVar36 * auVar52._8_4_ | (uint)!bVar36 * auVar55._8_4_;
        bVar36 = (bool)((byte)(uVar12 >> 3) & 1);
        auVar61._12_4_ = (uint)bVar36 * auVar52._12_4_ | (uint)!bVar36 * auVar55._12_4_;
        bVar36 = (bool)((byte)uVar13 & 1);
        auVar47._0_4_ = (uint)bVar36 * auVar53._0_4_ | (uint)!bVar36 * auVar56._0_4_;
        bVar36 = (bool)((byte)(uVar13 >> 1) & 1);
        auVar47._4_4_ = (uint)bVar36 * auVar53._4_4_ | (uint)!bVar36 * auVar56._4_4_;
        bVar36 = (bool)((byte)(uVar13 >> 2) & 1);
        auVar47._8_4_ = (uint)bVar36 * auVar53._8_4_ | (uint)!bVar36 * auVar56._8_4_;
        bVar36 = (bool)((byte)(uVar13 >> 3) & 1);
        auVar47._12_4_ = (uint)bVar36 * auVar53._12_4_ | (uint)!bVar36 * auVar56._12_4_;
        bVar36 = (bool)((byte)uVar14 & 1);
        auVar49._0_4_ = (float)((uint)bVar36 * auVar51._0_4_ | (uint)!bVar36 * auVar54._0_4_);
        bVar36 = (bool)((byte)(uVar14 >> 1) & 1);
        auVar49._4_4_ = (float)((uint)bVar36 * auVar51._4_4_ | (uint)!bVar36 * auVar54._4_4_);
        bVar36 = (bool)((byte)(uVar14 >> 2) & 1);
        auVar49._8_4_ = (float)((uint)bVar36 * auVar51._8_4_ | (uint)!bVar36 * auVar54._8_4_);
        bVar36 = (bool)((byte)(uVar14 >> 3) & 1);
        auVar49._12_4_ = (float)((uint)bVar36 * auVar51._12_4_ | (uint)!bVar36 * auVar54._12_4_);
        auVar52._0_4_ = fVar95 * auVar49._0_4_;
        auVar52._4_4_ = fVar98 * auVar49._4_4_;
        auVar52._8_4_ = fVar99 * auVar49._8_4_;
        auVar52._12_4_ = fVar100 * auVar49._12_4_;
        auVar40 = vfmadd213ps_fma(auVar42,auVar47,auVar52);
        auVar40 = vfmadd213ps_fma(auVar41,auVar61,auVar40);
        auVar51._0_4_ = auVar40._0_4_ + auVar40._0_4_;
        auVar51._4_4_ = auVar40._4_4_ + auVar40._4_4_;
        auVar51._8_4_ = auVar40._8_4_ + auVar40._8_4_;
        auVar51._12_4_ = auVar40._12_4_ + auVar40._12_4_;
        auVar40._0_4_ = auVar79._0_4_ * auVar49._0_4_;
        auVar40._4_4_ = auVar79._4_4_ * auVar49._4_4_;
        auVar40._8_4_ = auVar79._8_4_ * auVar49._8_4_;
        auVar40._12_4_ = auVar79._12_4_ * auVar49._12_4_;
        auVar40 = vfmadd213ps_fma(auVar76,auVar47,auVar40);
        auVar42 = vfmadd213ps_fma(auVar64,auVar61,auVar40);
        auVar40 = vrcp14ps_avx512vl(auVar51);
        auVar64 = vxorps_avx512vl(auVar51,auVar104._0_16_);
        auVar76 = auVar106._0_16_;
        auVar41 = vfnmadd213ps_avx512vl(auVar40,auVar51,auVar76);
        auVar41 = vfmadd132ps_fma(auVar41,auVar40,auVar40);
        auVar40 = *(undefined1 (*) [16])(ray + 0x80);
        auVar50._0_4_ = auVar41._0_4_ * (auVar42._0_4_ + auVar42._0_4_);
        auVar50._4_4_ = auVar41._4_4_ * (auVar42._4_4_ + auVar42._4_4_);
        auVar50._8_4_ = auVar41._8_4_ * (auVar42._8_4_ + auVar42._8_4_);
        auVar50._12_4_ = auVar41._12_4_ * (auVar42._12_4_ + auVar42._12_4_);
        uVar10 = vcmpps_avx512vl(auVar50,auVar40,2);
        uVar11 = vcmpps_avx512vl(auVar50,*(undefined1 (*) [16])(ray + 0x30),0xd);
        uVar15 = vcmpps_avx512vl(auVar51,auVar64,4);
        bVar24 = bVar24 & (byte)uVar10 & (byte)uVar11 & (byte)uVar15;
        if (bVar24 != 0) {
          pGVar5 = (context->scene->geometries).items[uVar38].ptr;
          uVar3 = pGVar5->mask;
          auVar41._4_4_ = uVar3;
          auVar41._0_4_ = uVar3;
          auVar41._8_4_ = uVar3;
          auVar41._12_4_ = uVar3;
          uVar10 = vptestmd_avx512vl(auVar41,*(undefined1 (*) [16])(ray + 0x90));
          bVar24 = bVar24 & (byte)uVar10 & 0xf;
          uVar38 = (ulong)bVar24;
          if (bVar24 != 0) {
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar42._8_4_ = 0x219392ef;
              auVar42._0_8_ = 0x219392ef219392ef;
              auVar42._12_4_ = 0x219392ef;
              uVar38 = vcmpps_avx512vl(auVar60,auVar42,5);
              auVar41 = vrcp14ps_avx512vl(auVar62);
              auVar42 = vfnmadd213ps_avx512vl(auVar62,auVar41,auVar76);
              auVar41 = vfmadd132ps_avx512vl(auVar42,auVar41,auVar41);
              fVar95 = (float)((uint)((byte)uVar38 & 1) * auVar41._0_4_);
              fVar98 = (float)((uint)((byte)(uVar38 >> 1) & 1) * auVar41._4_4_);
              fVar99 = (float)((uint)((byte)(uVar38 >> 2) & 1) * auVar41._8_4_);
              fVar100 = (float)((uint)((byte)(uVar38 >> 3) & 1) * auVar41._12_4_);
              auVar53._0_4_ = fVar95 * auVar39._0_4_;
              auVar53._4_4_ = fVar98 * auVar39._4_4_;
              auVar53._8_4_ = fVar99 * auVar39._8_4_;
              auVar53._12_4_ = fVar100 * auVar39._12_4_;
              local_1898 = vminps_avx512vl(auVar53,auVar76);
              auVar39._0_4_ = fVar95 * auVar43._0_4_;
              auVar39._4_4_ = fVar98 * auVar43._4_4_;
              auVar39._8_4_ = fVar99 * auVar43._8_4_;
              auVar39._12_4_ = fVar100 * auVar43._12_4_;
              local_1888 = vminps_avx512vl(auVar39,auVar76);
              local_1868 = vpbroadcastd_avx512vl();
              local_1878 = vpbroadcastd_avx512vl();
              local_18c8[0] = (RTCHitN)(char)auVar61._0_4_;
              local_18c8[1] = (RTCHitN)(char)(auVar61._0_4_ >> 8);
              local_18c8[2] = (RTCHitN)(char)(auVar61._0_4_ >> 0x10);
              local_18c8[3] = (RTCHitN)(char)(auVar61._0_4_ >> 0x18);
              local_18c8[4] = (RTCHitN)(char)auVar61._4_4_;
              local_18c8[5] = (RTCHitN)(char)(auVar61._4_4_ >> 8);
              local_18c8[6] = (RTCHitN)(char)(auVar61._4_4_ >> 0x10);
              local_18c8[7] = (RTCHitN)(char)(auVar61._4_4_ >> 0x18);
              local_18c8[8] = (RTCHitN)(char)auVar61._8_4_;
              local_18c8[9] = (RTCHitN)(char)(auVar61._8_4_ >> 8);
              local_18c8[10] = (RTCHitN)(char)(auVar61._8_4_ >> 0x10);
              local_18c8[0xb] = (RTCHitN)(char)(auVar61._8_4_ >> 0x18);
              local_18c8[0xc] = (RTCHitN)(char)auVar61._12_4_;
              local_18c8[0xd] = (RTCHitN)(char)(auVar61._12_4_ >> 8);
              local_18c8[0xe] = (RTCHitN)(char)(auVar61._12_4_ >> 0x10);
              local_18c8[0xf] = (RTCHitN)(char)(auVar61._12_4_ >> 0x18);
              local_18b8 = auVar47;
              local_18a8 = auVar49;
              vpcmpeqd_avx2(ZEXT1632(local_1898),ZEXT1632(local_1898));
              uStack_1854 = context->user->instID[0];
              local_1858 = uStack_1854;
              uStack_1850 = uStack_1854;
              uStack_184c = uStack_1854;
              uStack_1848 = context->user->instPrimID[0];
              uStack_1844 = uStack_1848;
              uStack_1840 = uStack_1848;
              uStack_183c = uStack_1848;
              auVar39 = vblendmps_avx512vl(auVar40,auVar50);
              bVar36 = (bool)(bVar24 >> 1 & 1);
              bVar7 = (bool)(bVar24 >> 2 & 1);
              *(uint *)(ray + 0x80) =
                   (uint)(bVar24 & 1) * auVar39._0_4_ | !(bool)(bVar24 & 1) * uStack_1848;
              *(uint *)(ray + 0x84) = (uint)bVar36 * auVar39._4_4_ | !bVar36 * uStack_1848;
              *(uint *)(ray + 0x88) = (uint)bVar7 * auVar39._8_4_ | !bVar7 * uStack_1848;
              *(uint *)(ray + 0x8c) =
                   (uint)(bVar24 >> 3) * auVar39._12_4_ | !(bool)(bVar24 >> 3) * uStack_1848;
              local_1978 = vpmovm2d_avx512vl((ulong)bVar24);
              args.valid = (int *)local_1978;
              args.geometryUserPtr = pGVar5->userPtr;
              args.context = context->user;
              args.hit = local_18c8;
              args.N = 4;
              args.ray = (RTCRayN *)ray;
              if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar5->occlusionFilterN)(&args);
                auVar39 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                auVar104 = ZEXT1664(auVar39);
                auVar39 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                auVar110 = ZEXT1664(auVar39);
                auVar39 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                auVar109 = ZEXT1664(auVar39);
                auVar39 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                auVar108 = ZEXT1664(auVar39);
                auVar39 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar107 = ZEXT1664(auVar39);
                auVar39 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                auVar106 = ZEXT1664(auVar39);
                auVar39 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar105 = ZEXT1664(auVar39);
              }
              uVar38 = vptestmd_avx512vl(local_1978,local_1978);
              if ((uVar38 & 0xf) == 0) {
                uVar38 = 0;
              }
              else {
                p_Var6 = context->args->filter;
                if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0))))
                {
                  (*p_Var6)(&args);
                  auVar39 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                  auVar104 = ZEXT1664(auVar39);
                  auVar39 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                  auVar110 = ZEXT1664(auVar39);
                  auVar39 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                  auVar109 = ZEXT1664(auVar39);
                  auVar39 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                  auVar108 = ZEXT1664(auVar39);
                  auVar39 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  auVar107 = ZEXT1664(auVar39);
                  auVar39 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar106 = ZEXT1664(auVar39);
                  auVar39 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  auVar105 = ZEXT1664(auVar39);
                }
                uVar38 = vptestmd_avx512vl(local_1978,local_1978);
                uVar38 = uVar38 & 0xf;
                auVar39 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                bVar36 = (bool)((byte)uVar38 & 1);
                auVar54._0_4_ =
                     (uint)bVar36 * auVar39._0_4_ | (uint)!bVar36 * *(int *)(args.ray + 0x80);
                bVar36 = (bool)((byte)(uVar38 >> 1) & 1);
                auVar54._4_4_ =
                     (uint)bVar36 * auVar39._4_4_ | (uint)!bVar36 * *(int *)(args.ray + 0x84);
                bVar36 = (bool)((byte)(uVar38 >> 2) & 1);
                auVar54._8_4_ =
                     (uint)bVar36 * auVar39._8_4_ | (uint)!bVar36 * *(int *)(args.ray + 0x88);
                bVar36 = SUB81(uVar38 >> 3,0);
                auVar54._12_4_ =
                     (uint)bVar36 * auVar39._12_4_ | (uint)!bVar36 * *(int *)(args.ray + 0x8c);
                *(undefined1 (*) [16])(args.ray + 0x80) = auVar54;
              }
              bVar36 = (bool)((byte)uVar38 & 1);
              auVar55._0_4_ = (uint)bVar36 * *(int *)local_1968 | (uint)!bVar36 * auVar40._0_4_;
              bVar36 = (bool)((byte)(uVar38 >> 1) & 1);
              auVar55._4_4_ =
                   (uint)bVar36 * *(int *)(local_1968 + 4) | (uint)!bVar36 * auVar40._4_4_;
              bVar36 = (bool)((byte)(uVar38 >> 2) & 1);
              auVar55._8_4_ =
                   (uint)bVar36 * *(int *)(local_1968 + 8) | (uint)!bVar36 * auVar40._8_4_;
              bVar36 = SUB81(uVar38 >> 3,0);
              auVar55._12_4_ =
                   (uint)bVar36 * *(int *)(local_1968 + 0xc) | (uint)!bVar36 * auVar40._12_4_;
              *(undefined1 (*) [16])local_1968 = auVar55;
            }
            bVar25 = ((byte)uVar38 ^ 0xf) & bVar25;
          }
        }
      }
      if (bVar25 == 0) {
        bVar25 = 0;
        break;
      }
      auVar39 = *(undefined1 (*) [16])ray;
      auVar43 = *(undefined1 (*) [16])(ray + 0x10);
      auVar40 = *(undefined1 (*) [16])(ray + 0x20);
      auVar41 = *(undefined1 (*) [16])(ray + 0x40);
      auVar42 = *(undefined1 (*) [16])(ray + 0x50);
      auVar62 = *(undefined1 (*) [16])(ray + 0x60);
      auVar21._4_4_ = uVar34;
      auVar21._0_4_ = uVar34;
      auVar21._8_4_ = uVar34;
      auVar21._12_4_ = uVar34;
      auVar64 = vsubps_avx(auVar21,auVar39);
      auVar20._4_4_ = uVar1;
      auVar20._0_4_ = uVar1;
      auVar20._8_4_ = uVar1;
      auVar20._12_4_ = uVar1;
      auVar76 = vsubps_avx(auVar20,auVar43);
      auVar56._4_4_ = uVar2;
      auVar56._0_4_ = uVar2;
      auVar56._8_4_ = uVar2;
      auVar56._12_4_ = uVar2;
      auVar79 = vsubps_avx(auVar56,auVar40);
      auVar60 = vsubps_avx(auVar44,auVar39);
      auVar61 = vsubps_avx(auVar45,auVar43);
      auVar44 = vsubps_avx512vl(auVar46,auVar40);
      auVar45 = vsubps_avx512vl(auVar101,auVar39);
      auVar43 = vsubps_avx512vl(auVar102,auVar43);
      auVar40 = vsubps_avx512vl(auVar103,auVar40);
      auVar46 = vsubps_avx512vl(auVar45,auVar64);
      auVar47 = vsubps_avx512vl(auVar43,auVar76);
      auVar48 = vsubps_avx512vl(auVar40,auVar79);
      auVar49 = vsubps_avx512vl(auVar64,auVar60);
      auVar50 = vsubps_avx512vl(auVar76,auVar61);
      auVar51 = vsubps_avx512vl(auVar79,auVar44);
      auVar52 = vsubps_avx512vl(auVar60,auVar45);
      auVar53 = vsubps_avx512vl(auVar61,auVar43);
      auVar54 = vsubps_avx512vl(auVar44,auVar40);
      auVar39 = vaddps_avx512vl(auVar45,auVar64);
      auVar55 = vaddps_avx512vl(auVar43,auVar76);
      auVar56 = vaddps_avx512vl(auVar40,auVar79);
      auVar57 = vmulps_avx512vl(auVar55,auVar48);
      auVar57 = vfmsub231ps_avx512vl(auVar57,auVar47,auVar56);
      auVar56 = vmulps_avx512vl(auVar56,auVar46);
      auVar56 = vfmsub231ps_avx512vl(auVar56,auVar48,auVar39);
      auVar83._0_4_ = auVar47._0_4_ * auVar39._0_4_;
      auVar83._4_4_ = auVar47._4_4_ * auVar39._4_4_;
      auVar83._8_4_ = auVar47._8_4_ * auVar39._8_4_;
      auVar83._12_4_ = auVar47._12_4_ * auVar39._12_4_;
      auVar39 = vfmsub231ps_fma(auVar83,auVar46,auVar55);
      fVar95 = auVar62._0_4_;
      auVar84._0_4_ = fVar95 * auVar39._0_4_;
      fVar98 = auVar62._4_4_;
      auVar84._4_4_ = fVar98 * auVar39._4_4_;
      fVar99 = auVar62._8_4_;
      auVar84._8_4_ = fVar99 * auVar39._8_4_;
      fVar100 = auVar62._12_4_;
      auVar84._12_4_ = fVar100 * auVar39._12_4_;
      auVar39 = vfmadd231ps_avx512vl(auVar84,auVar42,auVar56);
      auVar55 = vfmadd231ps_avx512vl(auVar39,auVar41,auVar57);
      auVar87._0_4_ = auVar60._0_4_ + auVar64._0_4_;
      auVar87._4_4_ = auVar60._4_4_ + auVar64._4_4_;
      auVar87._8_4_ = auVar60._8_4_ + auVar64._8_4_;
      auVar87._12_4_ = auVar60._12_4_ + auVar64._12_4_;
      auVar39 = vaddps_avx512vl(auVar76,auVar61);
      auVar56 = vaddps_avx512vl(auVar79,auVar44);
      auVar57 = vmulps_avx512vl(auVar39,auVar51);
      auVar57 = vfmsub231ps_avx512vl(auVar57,auVar50,auVar56);
      auVar56 = vmulps_avx512vl(auVar56,auVar49);
      auVar56 = vfmsub231ps_avx512vl(auVar56,auVar51,auVar87);
      auVar58 = vmulps_avx512vl(auVar87,auVar50);
      auVar39 = vfmsub231ps_avx512vl(auVar58,auVar49,auVar39);
      auVar88._0_4_ = fVar95 * auVar39._0_4_;
      auVar88._4_4_ = fVar98 * auVar39._4_4_;
      auVar88._8_4_ = fVar99 * auVar39._8_4_;
      auVar88._12_4_ = fVar100 * auVar39._12_4_;
      auVar39 = vfmadd231ps_avx512vl(auVar88,auVar42,auVar56);
      auVar56 = vfmadd231ps_avx512vl(auVar39,auVar41,auVar57);
      auVar57 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar104 = ZEXT1664(auVar57);
      auVar39 = vaddps_avx512vl(auVar60,auVar45);
      auVar43 = vaddps_avx512vl(auVar61,auVar43);
      auVar40 = vaddps_avx512vl(auVar44,auVar40);
      auVar60 = vmulps_avx512vl(auVar43,auVar54);
      auVar60 = vfmsub231ps_avx512vl(auVar60,auVar53,auVar40);
      auVar40 = vmulps_avx512vl(auVar40,auVar52);
      auVar40 = vfmsub231ps_avx512vl(auVar40,auVar54,auVar39);
      auVar44._0_4_ = auVar39._0_4_ * auVar53._0_4_;
      auVar44._4_4_ = auVar39._4_4_ * auVar53._4_4_;
      auVar44._8_4_ = auVar39._8_4_ * auVar53._8_4_;
      auVar44._12_4_ = auVar39._12_4_ * auVar53._12_4_;
      auVar39 = vfmsub231ps_fma(auVar44,auVar52,auVar43);
      auVar39 = vmulps_avx512vl(auVar39,auVar62);
      auVar39 = vfmadd231ps_avx512vl(auVar39,auVar42,auVar40);
      auVar39 = vfmadd231ps_avx512vl(auVar39,auVar41,auVar60);
      auVar45._0_4_ = auVar55._0_4_ + auVar56._0_4_;
      auVar45._4_4_ = auVar55._4_4_ + auVar56._4_4_;
      auVar45._8_4_ = auVar55._8_4_ + auVar56._8_4_;
      auVar45._12_4_ = auVar55._12_4_ + auVar56._12_4_;
      auVar43 = vaddps_avx512vl(auVar39,auVar45);
      auVar44 = auVar105._0_16_;
      auVar40 = vandps_avx512vl(auVar43,auVar44);
      auVar62 = vmulps_avx512vl(auVar40,auVar110._0_16_);
      auVar60 = vminps_avx512vl(auVar55,auVar56);
      auVar60 = vminps_avx512vl(auVar60,auVar39);
      auVar61 = vxorps_avx512vl(auVar62,auVar57);
      uVar10 = vcmpps_avx512vl(auVar60,auVar61,5);
      auVar60 = vmaxps_avx512vl(auVar55,auVar56);
      auVar39 = vmaxps_avx512vl(auVar60,auVar39);
      uVar11 = vcmpps_avx512vl(auVar39,auVar62,2);
      bVar24 = ((byte)uVar10 | (byte)uVar11) & 0xf & bVar25;
      if (bVar24 != 0) {
        auVar39 = vmulps_avx512vl(auVar50,auVar48);
        auVar62 = vmulps_avx512vl(auVar46,auVar51);
        auVar60 = vmulps_avx512vl(auVar49,auVar47);
        auVar61 = vmulps_avx512vl(auVar53,auVar51);
        auVar45 = vmulps_avx512vl(auVar49,auVar54);
        auVar58 = vmulps_avx512vl(auVar52,auVar50);
        auVar47 = vfmsub213ps_avx512vl(auVar47,auVar51,auVar39);
        auVar48 = vfmsub213ps_avx512vl(auVar48,auVar49,auVar62);
        auVar46 = vfmsub213ps_avx512vl(auVar46,auVar50,auVar60);
        auVar50 = vfmsub213ps_avx512vl(auVar54,auVar50,auVar61);
        auVar51 = vfmsub213ps_avx512vl(auVar52,auVar51,auVar45);
        auVar49 = vfmsub213ps_avx512vl(auVar53,auVar49,auVar58);
        auVar39 = vandps_avx512vl(auVar39,auVar44);
        auVar61 = vandps_avx512vl(auVar61,auVar44);
        uVar38 = vcmpps_avx512vl(auVar39,auVar61,1);
        auVar39 = vandps_avx512vl(auVar62,auVar44);
        auVar62 = vandps_avx512vl(auVar45,auVar44);
        uVar12 = vcmpps_avx512vl(auVar39,auVar62,1);
        auVar39 = vandps_avx512vl(auVar60,auVar44);
        auVar62 = vandps_avx512vl(auVar58,auVar44);
        uVar13 = vcmpps_avx512vl(auVar39,auVar62,1);
        bVar36 = (bool)((byte)uVar38 & 1);
        auVar65._0_4_ = (uint)bVar36 * auVar47._0_4_ | (uint)!bVar36 * auVar50._0_4_;
        bVar36 = (bool)((byte)(uVar38 >> 1) & 1);
        auVar65._4_4_ = (uint)bVar36 * auVar47._4_4_ | (uint)!bVar36 * auVar50._4_4_;
        bVar36 = (bool)((byte)(uVar38 >> 2) & 1);
        auVar65._8_4_ = (uint)bVar36 * auVar47._8_4_ | (uint)!bVar36 * auVar50._8_4_;
        bVar36 = (bool)((byte)(uVar38 >> 3) & 1);
        auVar65._12_4_ = (uint)bVar36 * auVar47._12_4_ | (uint)!bVar36 * auVar50._12_4_;
        bVar36 = (bool)((byte)uVar12 & 1);
        auVar66._0_4_ = (uint)bVar36 * auVar48._0_4_ | (uint)!bVar36 * auVar51._0_4_;
        bVar36 = (bool)((byte)(uVar12 >> 1) & 1);
        auVar66._4_4_ = (uint)bVar36 * auVar48._4_4_ | (uint)!bVar36 * auVar51._4_4_;
        bVar36 = (bool)((byte)(uVar12 >> 2) & 1);
        auVar66._8_4_ = (uint)bVar36 * auVar48._8_4_ | (uint)!bVar36 * auVar51._8_4_;
        bVar36 = (bool)((byte)(uVar12 >> 3) & 1);
        auVar66._12_4_ = (uint)bVar36 * auVar48._12_4_ | (uint)!bVar36 * auVar51._12_4_;
        bVar36 = (bool)((byte)uVar13 & 1);
        auVar67._0_4_ = (float)((uint)bVar36 * auVar46._0_4_ | (uint)!bVar36 * auVar49._0_4_);
        bVar36 = (bool)((byte)(uVar13 >> 1) & 1);
        auVar67._4_4_ = (float)((uint)bVar36 * auVar46._4_4_ | (uint)!bVar36 * auVar49._4_4_);
        bVar36 = (bool)((byte)(uVar13 >> 2) & 1);
        auVar67._8_4_ = (float)((uint)bVar36 * auVar46._8_4_ | (uint)!bVar36 * auVar49._8_4_);
        bVar36 = (bool)((byte)(uVar13 >> 3) & 1);
        auVar67._12_4_ = (float)((uint)bVar36 * auVar46._12_4_ | (uint)!bVar36 * auVar49._12_4_);
        auVar97._0_4_ = fVar95 * auVar67._0_4_;
        auVar97._4_4_ = fVar98 * auVar67._4_4_;
        auVar97._8_4_ = fVar99 * auVar67._8_4_;
        auVar97._12_4_ = fVar100 * auVar67._12_4_;
        auVar39 = vfmadd213ps_fma(auVar42,auVar66,auVar97);
        auVar39 = vfmadd213ps_fma(auVar41,auVar65,auVar39);
        auVar92._0_4_ = auVar39._0_4_ + auVar39._0_4_;
        auVar92._4_4_ = auVar39._4_4_ + auVar39._4_4_;
        auVar92._8_4_ = auVar39._8_4_ + auVar39._8_4_;
        auVar92._12_4_ = auVar39._12_4_ + auVar39._12_4_;
        auVar94._0_4_ = auVar79._0_4_ * auVar67._0_4_;
        auVar94._4_4_ = auVar79._4_4_ * auVar67._4_4_;
        auVar94._8_4_ = auVar79._8_4_ * auVar67._8_4_;
        auVar94._12_4_ = auVar79._12_4_ * auVar67._12_4_;
        auVar39 = vfmadd213ps_fma(auVar76,auVar66,auVar94);
        auVar42 = vfmadd213ps_fma(auVar64,auVar65,auVar39);
        auVar39 = vrcp14ps_avx512vl(auVar92);
        auVar62 = vxorps_avx512vl(auVar92,auVar57);
        auVar64 = auVar106._0_16_;
        auVar41 = vfnmadd213ps_avx512vl(auVar39,auVar92,auVar64);
        auVar41 = vfmadd132ps_fma(auVar41,auVar39,auVar39);
        auVar39 = *(undefined1 (*) [16])(ray + 0x80);
        auVar46._0_4_ = auVar41._0_4_ * (auVar42._0_4_ + auVar42._0_4_);
        auVar46._4_4_ = auVar41._4_4_ * (auVar42._4_4_ + auVar42._4_4_);
        auVar46._8_4_ = auVar41._8_4_ * (auVar42._8_4_ + auVar42._8_4_);
        auVar46._12_4_ = auVar41._12_4_ * (auVar42._12_4_ + auVar42._12_4_);
        uVar10 = vcmpps_avx512vl(auVar46,auVar39,2);
        uVar11 = vcmpps_avx512vl(auVar46,*(undefined1 (*) [16])(ray + 0x30),0xd);
        uVar15 = vcmpps_avx512vl(auVar92,auVar62,4);
        bVar24 = bVar24 & (byte)uVar10 & (byte)uVar11 & (byte)uVar15;
        if (bVar24 != 0) {
          pGVar5 = (context->scene->geometries).items[*(uint *)(lVar27 + uVar32 * 4)].ptr;
          uVar3 = pGVar5->mask;
          auVar91._4_4_ = uVar3;
          auVar91._0_4_ = uVar3;
          auVar91._8_4_ = uVar3;
          auVar91._12_4_ = uVar3;
          uVar10 = vptestmd_avx512vl(auVar91,*(undefined1 (*) [16])(ray + 0x90));
          bVar24 = bVar24 & (byte)uVar10 & 0xf;
          uVar38 = (ulong)bVar24;
          if (bVar24 != 0) {
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar16._8_4_ = 0x219392ef;
              auVar16._0_8_ = 0x219392ef219392ef;
              auVar16._12_4_ = 0x219392ef;
              uVar12 = vcmpps_avx512vl(auVar40,auVar16,5);
              auVar40 = vrcp14ps_avx512vl(auVar43);
              auVar43 = vfnmadd213ps_avx512vl(auVar43,auVar40,auVar64);
              auVar43 = vfmadd132ps_avx512vl(auVar43,auVar40,auVar40);
              fVar95 = (float)((uint)((byte)uVar12 & 1) * auVar43._0_4_);
              fVar98 = (float)((uint)((byte)(uVar12 >> 1) & 1) * auVar43._4_4_);
              fVar99 = (float)((uint)((byte)(uVar12 >> 2) & 1) * auVar43._8_4_);
              fVar100 = (float)((uint)((byte)(uVar12 >> 3) & 1) * auVar43._12_4_);
              auVar85._0_4_ = fVar95 * auVar55._0_4_;
              auVar85._4_4_ = fVar98 * auVar55._4_4_;
              auVar85._8_4_ = fVar99 * auVar55._8_4_;
              auVar85._12_4_ = fVar100 * auVar55._12_4_;
              auVar43 = vminps_avx512vl(auVar85,auVar64);
              auVar89._0_4_ = fVar95 * auVar56._0_4_;
              auVar89._4_4_ = fVar98 * auVar56._4_4_;
              auVar89._8_4_ = fVar99 * auVar56._8_4_;
              auVar89._12_4_ = fVar100 * auVar56._12_4_;
              auVar40 = vminps_avx512vl(auVar89,auVar64);
              local_1898 = vsubps_avx512vl(auVar64,auVar43);
              local_1888 = vsubps_avx512vl(auVar64,auVar40);
              local_1868 = vpbroadcastd_avx512vl();
              local_1878 = vpbroadcastd_avx512vl();
              local_18c8[0] = (RTCHitN)(char)auVar65._0_4_;
              local_18c8[1] = (RTCHitN)(char)(auVar65._0_4_ >> 8);
              local_18c8[2] = (RTCHitN)(char)(auVar65._0_4_ >> 0x10);
              local_18c8[3] = (RTCHitN)(char)(auVar65._0_4_ >> 0x18);
              local_18c8[4] = (RTCHitN)(char)auVar65._4_4_;
              local_18c8[5] = (RTCHitN)(char)(auVar65._4_4_ >> 8);
              local_18c8[6] = (RTCHitN)(char)(auVar65._4_4_ >> 0x10);
              local_18c8[7] = (RTCHitN)(char)(auVar65._4_4_ >> 0x18);
              local_18c8[8] = (RTCHitN)(char)auVar65._8_4_;
              local_18c8[9] = (RTCHitN)(char)(auVar65._8_4_ >> 8);
              local_18c8[10] = (RTCHitN)(char)(auVar65._8_4_ >> 0x10);
              local_18c8[0xb] = (RTCHitN)(char)(auVar65._8_4_ >> 0x18);
              local_18c8[0xc] = (RTCHitN)(char)auVar65._12_4_;
              local_18c8[0xd] = (RTCHitN)(char)(auVar65._12_4_ >> 8);
              local_18c8[0xe] = (RTCHitN)(char)(auVar65._12_4_ >> 0x10);
              local_18c8[0xf] = (RTCHitN)(char)(auVar65._12_4_ >> 0x18);
              local_18b8 = auVar66;
              local_18a8 = auVar67;
              vpcmpeqd_avx2(ZEXT1632(auVar66),ZEXT1632(auVar66));
              uStack_1854 = context->user->instID[0];
              local_1858 = uStack_1854;
              uStack_1850 = uStack_1854;
              uStack_184c = uStack_1854;
              uStack_1848 = context->user->instPrimID[0];
              uStack_1844 = uStack_1848;
              uStack_1840 = uStack_1848;
              uStack_183c = uStack_1848;
              auVar43 = vblendmps_avx512vl(auVar39,auVar46);
              bVar36 = (bool)(bVar24 >> 1 & 1);
              bVar7 = (bool)(bVar24 >> 2 & 1);
              *(uint *)(ray + 0x80) =
                   (uint)(bVar24 & 1) * auVar43._0_4_ | !(bool)(bVar24 & 1) * uStack_1848;
              *(uint *)(ray + 0x84) = (uint)bVar36 * auVar43._4_4_ | !bVar36 * uStack_1848;
              *(uint *)(ray + 0x88) = (uint)bVar7 * auVar43._8_4_ | !bVar7 * uStack_1848;
              *(uint *)(ray + 0x8c) =
                   (uint)(bVar24 >> 3) * auVar43._12_4_ | !(bool)(bVar24 >> 3) * uStack_1848;
              local_1978 = vpmovm2d_avx512vl(uVar38);
              args.valid = (int *)local_1978;
              args.geometryUserPtr = pGVar5->userPtr;
              args.context = context->user;
              args.hit = local_18c8;
              args.N = 4;
              args.ray = (RTCRayN *)ray;
              if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar5->occlusionFilterN)(&args);
                auVar43 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                auVar104 = ZEXT1664(auVar43);
                auVar43 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                auVar110 = ZEXT1664(auVar43);
                auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                auVar109 = ZEXT1664(auVar43);
                auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                auVar108 = ZEXT1664(auVar43);
                auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar107 = ZEXT1664(auVar43);
                auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                auVar106 = ZEXT1664(auVar43);
                auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar105 = ZEXT1664(auVar43);
              }
              uVar38 = vptestmd_avx512vl(local_1978,local_1978);
              if ((uVar38 & 0xf) == 0) {
                uVar38 = 0;
              }
              else {
                p_Var6 = context->args->filter;
                if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0))))
                {
                  (*p_Var6)(&args);
                  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                  auVar104 = ZEXT1664(auVar43);
                  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                  auVar110 = ZEXT1664(auVar43);
                  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                  auVar109 = ZEXT1664(auVar43);
                  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                  auVar108 = ZEXT1664(auVar43);
                  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  auVar107 = ZEXT1664(auVar43);
                  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar106 = ZEXT1664(auVar43);
                  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  auVar105 = ZEXT1664(auVar43);
                }
                uVar38 = vptestmd_avx512vl(local_1978,local_1978);
                uVar38 = uVar38 & 0xf;
                auVar43 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                bVar36 = (bool)((byte)uVar38 & 1);
                auVar68._0_4_ =
                     (uint)bVar36 * auVar43._0_4_ | (uint)!bVar36 * *(int *)(args.ray + 0x80);
                bVar36 = (bool)((byte)(uVar38 >> 1) & 1);
                auVar68._4_4_ =
                     (uint)bVar36 * auVar43._4_4_ | (uint)!bVar36 * *(int *)(args.ray + 0x84);
                bVar36 = (bool)((byte)(uVar38 >> 2) & 1);
                auVar68._8_4_ =
                     (uint)bVar36 * auVar43._8_4_ | (uint)!bVar36 * *(int *)(args.ray + 0x88);
                bVar36 = SUB81(uVar38 >> 3,0);
                auVar68._12_4_ =
                     (uint)bVar36 * auVar43._12_4_ | (uint)!bVar36 * *(int *)(args.ray + 0x8c);
                *(undefined1 (*) [16])(args.ray + 0x80) = auVar68;
              }
              bVar36 = (bool)((byte)uVar38 & 1);
              auVar69._0_4_ = (uint)bVar36 * *(int *)local_1968 | (uint)!bVar36 * auVar39._0_4_;
              bVar36 = (bool)((byte)(uVar38 >> 1) & 1);
              auVar69._4_4_ =
                   (uint)bVar36 * *(int *)(local_1968 + 4) | (uint)!bVar36 * auVar39._4_4_;
              bVar36 = (bool)((byte)(uVar38 >> 2) & 1);
              auVar69._8_4_ =
                   (uint)bVar36 * *(int *)(local_1968 + 8) | (uint)!bVar36 * auVar39._8_4_;
              bVar36 = SUB81(uVar38 >> 3,0);
              auVar69._12_4_ =
                   (uint)bVar36 * *(int *)(local_1968 + 0xc) | (uint)!bVar36 * auVar39._12_4_;
              *(undefined1 (*) [16])local_1968 = auVar69;
            }
            bVar25 = ((byte)uVar38 ^ 0xf) & bVar25;
          }
        }
      }
      if ((bVar25 == 0) || (bVar36 = 2 < uVar32, uVar32 = uVar32 + 1, bVar36)) break;
    }
    bVar22 = bVar22 & bVar25;
    if (bVar22 == 0) break;
  }
  bVar22 = bVar22 ^ 0xf;
LAB_006a560e:
  bVar30 = bVar30 | bVar22;
  if (bVar30 == 0xf) {
    bVar30 = 0xf;
    goto LAB_006a5743;
  }
  auVar39 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  bVar36 = (bool)(bVar30 >> 1 & 1);
  bVar7 = (bool)(bVar30 >> 2 & 1);
  bVar8 = (bool)(bVar30 >> 3 & 1);
  tray.tfar.field_0.i[1] = (uint)bVar36 * auVar39._4_4_ | (uint)!bVar36 * tray.tfar.field_0.i[1];
  tray.tfar.field_0.i[0] =
       (uint)(bVar30 & 1) * auVar39._0_4_ | (uint)!(bool)(bVar30 & 1) * tray.tfar.field_0.i[0];
  tray.tfar.field_0.i[2] = (uint)bVar7 * auVar39._8_4_ | (uint)!bVar7 * tray.tfar.field_0.i[2];
  tray.tfar.field_0.i[3] = (uint)bVar8 * auVar39._12_4_ | (uint)!bVar8 * tray.tfar.field_0.i[3];
  goto LAB_006a470d;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }